

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool __thiscall libcellml::Model::doAddComponent(Model *this,ComponentPtr *component)

{
  bool bVar1;
  element_type *peVar2;
  ComponentImpl *this_00;
  bool local_91;
  shared_ptr<libcellml::ParentedEntity> local_80;
  ParentedEntity local_70;
  shared_ptr<libcellml::Entity> local_60;
  byte local_49;
  ParentedEntity local_48 [2];
  undefined1 local_28 [8];
  shared_ptr<libcellml::Model> thisModel;
  ComponentPtr *component_local;
  Model *this_local;
  
  thisModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)component;
  std::enable_shared_from_this<libcellml::Model>::shared_from_this
            ((enable_shared_from_this<libcellml::Model> *)local_28);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)thisModel.
                           super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
  local_49 = 0;
  bVar1 = ParentedEntity::hasParent((ParentedEntity *)peVar2);
  local_91 = false;
  if (bVar1) {
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)thisModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi);
    ParentedEntity::parent(local_48);
    local_49 = 1;
    local_91 = std::operator!=((shared_ptr<libcellml::Model> *)local_28,
                               (shared_ptr<libcellml::ParentedEntity> *)local_48);
  }
  if ((local_49 & 1) != 0) {
    std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr
              ((shared_ptr<libcellml::ParentedEntity> *)local_48);
  }
  if (local_91 != false) {
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)thisModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi);
    ParentedEntity::parent(&local_70);
    std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::ParentedEntity,void>
              (&local_60,(shared_ptr<libcellml::ParentedEntity> *)&local_70);
    removeComponentFromEntity
              (&local_60,
               (ComponentPtr *)
               thisModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_60);
    std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr
              ((shared_ptr<libcellml::ParentedEntity> *)&local_70);
  }
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)thisModel.
                           super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
  this_00 = Component::pFunc(peVar2);
  std::shared_ptr<libcellml::ParentedEntity>::shared_ptr<libcellml::Model,void>
            (&local_80,(shared_ptr<libcellml::Model> *)local_28);
  ParentedEntity::ParentedEntityImpl::setParent((ParentedEntityImpl *)this_00,&local_80);
  std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr(&local_80);
  bVar1 = ComponentEntity::doAddComponent
                    (&this->super_ComponentEntity,
                     (ComponentPtr *)
                     thisModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_28);
  return bVar1;
}

Assistant:

bool Model::doAddComponent(const ComponentPtr &component)
{
    auto thisModel = shared_from_this();
    if (component->hasParent() && (thisModel != component->parent())) {
        removeComponentFromEntity(component->parent(), component);
    }
    component->pFunc()->setParent(thisModel);

    return ComponentEntity::doAddComponent(component);
}